

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptionSetter.cpp
# Opt level: O2

void curlpp::internal::
     OptionSetter<utilspp::Functor<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>,_(CURLoption)20056>
     ::setOpt(CurlHandle *handle,ParamType value)

{
  undefined4 extraout_var;
  Functor<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>
  local_18;
  
  CurlHandle::option<int(*)(curlpp::internal::CurlHandle*,double,double,double,double)>
            (handle,CURLOPT_PROGRESSFUNCTION,Callbacks::ProgressCallback);
  CurlHandle::option<curlpp::internal::CurlHandle*>(handle,CURLOPT_XFERINFODATA,handle);
  local_18.mImpl._M_ptr._0_4_ = (*((value->mImpl)._M_ptr)->_vptr_FunctorImpl[1])();
  local_18.mImpl._M_ptr._4_4_ = extraout_var;
  utilspp::
  Functor<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>
  ::operator=(&handle->mProgressFunctor,&local_18);
  if (local_18.mImpl._M_ptr !=
      (FunctorImpl<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>
       *)0x0) {
    (**(code **)(*(long *)local_18.mImpl._M_ptr + 0x18))();
  }
  return;
}

Assistant:

void OptionSetter<curlpp::types::ProgressFunctionFunctor, CURLOPT_PROGRESSFUNCTION>
::setOpt(internal::CurlHandle * handle, ParamType value)
{
	handle->option(CURLOPT_PROGRESSFUNCTION, Callbacks::ProgressCallback);
	handle->option(CURLOPT_PROGRESSDATA, handle);
	handle->setProgressFunctor(value);
}